

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int ddDoDumpBlif(DdManager *dd,DdNode *f,FILE *fp,st__table *visited,char **names,int mv)

{
  DdNode *f_00;
  DdNode *pDVar1;
  int iVar2;
  char *__format;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = 0;
  iVar2 = st__lookup(visited,(char *)f,(char **)0x0);
  if (iVar2 == 1) {
    uVar4 = 1;
  }
  else if (f != (DdNode *)0x0) {
    uVar4 = 0;
    iVar2 = st__insert(visited,(char *)f,(char *)0x0);
    if (iVar2 != -10000) {
      if (dd->one == f) {
        iVar2 = fprintf((FILE *)fp,".names %lx\n1\n",(ulong)f / 0x28);
      }
      else if (dd->zero == f) {
        pcVar3 = "0\n";
        if (mv == 0) {
          pcVar3 = "";
        }
        iVar2 = fprintf((FILE *)fp,".names %lx\n%s",(ulong)f / 0x28,pcVar3);
      }
      else {
        if (f->index == 0x7fffffff) {
          return 0;
        }
        f_00 = (f->type).kids.T;
        iVar2 = ddDoDumpBlif(dd,f_00,fp,visited,names,mv);
        if (iVar2 != 1) {
          return iVar2;
        }
        pDVar1 = (f->type).kids.E;
        iVar2 = ddDoDumpBlif(dd,(DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe),fp,visited,names,mv);
        if (iVar2 != 1) {
          return iVar2;
        }
        if (names == (char **)0x0) {
          iVar2 = fprintf((FILE *)fp,".names %u");
        }
        else {
          iVar2 = fprintf((FILE *)fp,".names %s",names[f->index]);
        }
        if (iVar2 == -1) {
          return 0;
        }
        bVar5 = (undefined1  [16])((undefined1  [16])f->type & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0;
        pcVar3 = " %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 0 1\n";
        if (bVar5) {
          pcVar3 = " %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 1 1\n";
        }
        __format = " %lx %lx %lx\n11- 1\n0-0 1\n";
        if (bVar5) {
          __format = " %lx %lx %lx\n11- 1\n0-1 1\n";
        }
        if (mv != 0) {
          __format = pcVar3;
        }
        iVar2 = fprintf((FILE *)fp,__format,(ulong)f_00 / 0x28,(ulong)pDVar1 / 0x28,(ulong)f / 0x28)
        ;
      }
      uVar4 = (uint)(iVar2 != -1);
    }
  }
  return uVar4;
}

Assistant:

static int
ddDoDumpBlif(
  DdManager * dd,
  DdNode * f,
  FILE * fp,
  st__table * visited,
  char ** names,
  int mv)
{
    DdNode      *T, *E;
    int         retval;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    /* If already visited, nothing to do. */
    if ( st__is_member(visited, (char *) f) == 1)
        return(1);

    /* Check for abnormal condition that should never happen. */
    if (f == NULL)
        return(0);

    /* Mark node as visited. */
    if ( st__insert(visited, (char *) f, NULL) == st__OUT_OF_MEM)
        return(0);

    /* Check for special case: If constant node, generate constant 1. */
    if (f == DD_ONE(dd)) {
#if SIZEOF_VOID_P == 8
        retval = fprintf(fp, ".names %lx\n1\n",(ptruint) f / (ptruint) sizeof(DdNode));
#else
        retval = fprintf(fp, ".names %x\n1\n",(ptruint) f / (ptruint) sizeof(DdNode));
#endif
        if (retval == EOF) {
            return(0);
        } else {
            return(1);
        }
    }

    /* Check whether this is an ADD. We deal with 0-1 ADDs, but not
    ** with the general case.
    */
    if (f == DD_ZERO(dd)) {
#if SIZEOF_VOID_P == 8
        retval = fprintf(fp, ".names %lx\n%s",
                         (ptruint) f / (ptruint) sizeof(DdNode),
                         mv ? "0\n" : "");
#else
        retval = fprintf(fp, ".names %x\n%s",
                         (ptruint) f / (ptruint) sizeof(DdNode),
                         mv ? "0\n" : "");
#endif
        if (retval == EOF) {
            return(0);
        } else {
            return(1);
        }
    }
    if (cuddIsConstant(f))
        return(0);

    /* Recursive calls. */
    T = cuddT(f);
    retval = ddDoDumpBlif(dd,T,fp,visited,names,mv);
    if (retval != 1) return(retval);
    E = Cudd_Regular(cuddE(f));
    retval = ddDoDumpBlif(dd,E,fp,visited,names,mv);
    if (retval != 1) return(retval);

    /* Write multiplexer taking complement arc into account. */
    if (names != NULL) {
        retval = fprintf(fp,".names %s", names[f->index]);
    } else {
#if SIZEOF_VOID_P == 8 && SIZEOF_INT == 4
        retval = fprintf(fp,".names %u", f->index);
#else
        retval = fprintf(fp,".names %hu", f->index);
#endif
    }
    if (retval == EOF)
        return(0);

#if SIZEOF_VOID_P == 8
    if (mv) {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    } else {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %lx %lx %lx\n11- 1\n0-0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %lx %lx %lx\n11- 1\n0-1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    }
#else
    if (mv) {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %x %x %x\n.def 0\n1 1 - 1\n0 - 0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %x %x %x\n.def 0\n1 1 - 1\n0 - 1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    } else {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %x %x %x\n11- 1\n0-0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %x %x %x\n11- 1\n0-1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    }
#endif
    if (retval == EOF) {
        return(0);
    } else {
        return(1);
    }

}